

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_node_mapping_append(fy_node *fyn_map,fy_node *fyn_key,fy_node *fyn_value)

{
  fy_node_pair *_n;
  fy_node_pair *fynp;
  fy_node *fyn_value_local;
  fy_node *fyn_key_local;
  fy_node *fyn_map_local;
  
  _n = fy_node_mapping_pair_insert_prepare(fyn_map,fyn_key,fyn_value);
  if (_n == (fy_node_pair *)0x0) {
    fyn_map_local._4_4_ = -1;
  }
  else {
    fy_node_pair_list_add_tail(&(fyn_map->field_12).mapping,_n);
    if (fyn_map->xl != (fy_accel *)0x0) {
      fy_accel_insert(fyn_map->xl,fyn_key,_n);
    }
    if (fyn_key != (fy_node *)0x0) {
      fyn_key->field_0x34 = fyn_key->field_0x34 & 0xf7 | 8;
    }
    if (fyn_value != (fy_node *)0x0) {
      fyn_value->field_0x34 = fyn_value->field_0x34 & 0xf7 | 8;
    }
    fy_node_mark_synthetic(fyn_map);
    fyn_map_local._4_4_ = 0;
  }
  return fyn_map_local._4_4_;
}

Assistant:

int fy_node_mapping_append(struct fy_node *fyn_map,
                           struct fy_node *fyn_key, struct fy_node *fyn_value) {
    struct fy_node_pair *fynp;

    fynp = fy_node_mapping_pair_insert_prepare(fyn_map, fyn_key, fyn_value);
    if (!fynp)
        return -1;

    fy_node_pair_list_add_tail(&fyn_map->mapping, fynp);
    if (fyn_map->xl)
        fy_accel_insert(fyn_map->xl, fyn_key, fynp);

    if (fyn_key)
        fyn_key->attached = true;
    if (fyn_value)
        fyn_value->attached = true;

    fy_node_mark_synthetic(fyn_map);

    return 0;
}